

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O2

bool __thiscall
Handler::SortDeployedVM::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,uint32_t *a,uint32_t *b)

{
  pointer pDVar1;
  pointer pVVar2;
  
  pDVar1 = (this->this->deployedVMs).
           super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->this->virtualMachines).
           super__Vector_base<VirtualMachine,_std::allocator<VirtualMachine>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pDVar1[*a].location == true) {
    if (pDVar1[*b].location == false) {
      return true;
    }
  }
  else if (pDVar1[*b].location != false) {
    return false;
  }
  return (uint)pVVar2[pDVar1[*b].vmIdx].memorySize + (uint)pVVar2[pDVar1[*b].vmIdx].cpuCore <
         (uint)pVVar2[pDVar1[*a].vmIdx].memorySize + (uint)pVVar2[pDVar1[*a].vmIdx].cpuCore;
}

Assistant:

void Handler::SortDeployedVM(std::vector<uint32_t> &deployedVMIndexes) {
    std::sort(deployedVMIndexes.begin(), deployedVMIndexes.end(), [this](const uint32_t &a, const uint32_t &b) {
        const DeployedVirtualMachine &deployedVM1 = deployedVMs[a];
        const DeployedVirtualMachine &deployedVM2 = deployedVMs[b];
        const VirtualMachine &vm1 = virtualMachines[deployedVM1.vmIdx];
        const VirtualMachine &vm2 = virtualMachines[deployedVM2.vmIdx];

        if (deployedVM1.location && !deployedVM2.location) return true;
        else if (!deployedVM1.location && deployedVM2.location) return false;
        else return vm1.cpuCore + vm1.memorySize > vm2.cpuCore + vm2.memorySize;
    });
}